

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

char * sx_EOL_LF(char *dest,int dest_sz,char *src)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  
  if (0 < dest_sz) {
    pcVar1 = dest + ((ulong)(uint)dest_sz - 1);
    cVar2 = *src;
    if (dest < pcVar1 && cVar2 != '\0') {
      pcVar3 = src + 1;
      do {
        if (cVar2 != '\r') {
          *dest = cVar2;
          dest = dest + 1;
        }
        cVar2 = *pcVar3;
      } while ((cVar2 != '\0') && (pcVar3 = pcVar3 + 1, dest < pcVar1));
    }
    *dest = '\0';
    return dest;
  }
  __assert_fail("dest_sz > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",0x26f,
                "char *sx_EOL_LF(char *, int, const char *)");
}

Assistant:

char* sx_EOL_LF(char* dest, int dest_sz, const char* src)
{
    assert(dest_sz > 0);
    char* end = dest + dest_sz - 1;
    for (char ch = *src++; ch != '\0' && dest < end; ch = *src++) {
        if ('\r' != ch)
            *dest++ = ch;
    }
    *dest = '\0';
    return dest;
}